

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerfactory.h
# Opt level: O0

Timer * soplex::TimerFactory::switchTimer(Timer *timer,TYPE ttype)

{
  int iVar1;
  int in_ESI;
  Timer *in_RDI;
  Timer *local_8;
  
  iVar1 = (*in_RDI->_vptr_Timer[5])();
  local_8 = in_RDI;
  if (in_ESI != iVar1) {
    spx_free<soplex::Timer*>((Timer **)0x41c674);
    local_8 = createTimer(timer._4_4_);
  }
  return local_8;
}

Assistant:

static Timer* switchTimer(Timer* timer, Timer::TYPE ttype)
   {
      // check whether the type is different from the current one
      if(ttype != timer->type())
      {
         // @todo transfer the old times
         spx_free(timer);
         timer = createTimer(ttype);
      }

      return timer;
   }